

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O1

fy_token * fy_token_vcreate(fy_token_type type,__va_list_tag *ap)

{
  uint uVar1;
  size_t *psVar2;
  fy_token *pfVar3;
  fy_input *pfVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  fy_token *fyt;
  long *plVar9;
  uint *puVar10;
  
  if ((type < (FYTT_INPUT_MARKER|FYTT_STREAM_START)) &&
     (fyt = fy_token_alloc(), fyt != (fy_token *)0x0)) {
    fyt->type = type;
    uVar1 = ap->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      plVar9 = (long *)((ulong)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      plVar9 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = plVar9 + 1;
    }
    psVar2 = (size_t *)*plVar9;
    if (psVar2 != (size_t *)0x0) {
      *(size_t *)&(fyt->handle).increment = psVar2[6];
      sVar5 = *psVar2;
      sVar6 = psVar2[1];
      sVar7 = psVar2[2];
      sVar8 = psVar2[3];
      pfVar4 = (fy_input *)psVar2[5];
      (fyt->handle).storage_hint = psVar2[4];
      (fyt->handle).fyi = pfVar4;
      (fyt->handle).end_mark.input_pos = sVar7;
      (fyt->handle).end_mark.line = (int)sVar8;
      (fyt->handle).end_mark.column = (int)(sVar8 >> 0x20);
      (fyt->handle).start_mark.input_pos = sVar5;
      (fyt->handle).start_mark.line = (int)sVar6;
      (fyt->handle).start_mark.column = (int)(sVar6 >> 0x20);
      if ((int)type < 0x14) {
        if (type == FYTT_NONE) goto LAB_0013cbbd;
        if (type == FYTT_TAG_DIRECTIVE) {
          uVar1 = ap->gp_offset;
          if ((ulong)uVar1 < 0x29) {
            puVar10 = (uint *)((ulong)uVar1 + (long)ap->reg_save_area);
            ap->gp_offset = uVar1 + 8;
          }
          else {
            puVar10 = (uint *)ap->overflow_arg_area;
            ap->overflow_arg_area = puVar10 + 2;
          }
          (fyt->field_9).tag_directive.tag_length = *puVar10;
          uVar1 = ap->gp_offset;
          if ((ulong)uVar1 < 0x29) {
            puVar10 = (uint *)((ulong)uVar1 + (long)ap->reg_save_area);
            ap->gp_offset = uVar1 + 8;
          }
          else {
            puVar10 = (uint *)ap->overflow_arg_area;
            ap->overflow_arg_area = puVar10 + 2;
          }
          (fyt->field_9).tag_directive.uri_length = *puVar10;
        }
      }
      else if (type == FYTT_TAG) {
        uVar1 = ap->gp_offset;
        if ((ulong)uVar1 < 0x29) {
          puVar10 = (uint *)((ulong)uVar1 + (long)ap->reg_save_area);
          ap->gp_offset = uVar1 + 8;
        }
        else {
          puVar10 = (uint *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar10 + 2;
        }
        (fyt->field_9).tag_directive.tag_length = *puVar10;
        uVar1 = ap->gp_offset;
        if ((ulong)uVar1 < 0x29) {
          puVar10 = (uint *)((ulong)uVar1 + (long)ap->reg_save_area);
          ap->gp_offset = uVar1 + 8;
        }
        else {
          puVar10 = (uint *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar10 + 2;
        }
        (fyt->field_9).tag_directive.uri_length = *puVar10;
        uVar1 = ap->gp_offset;
        if ((ulong)uVar1 < 0x29) {
          puVar10 = (uint *)((ulong)uVar1 + (long)ap->reg_save_area);
          ap->gp_offset = uVar1 + 8;
        }
        else {
          puVar10 = (uint *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar10 + 2;
        }
        (fyt->field_9).tag.suffix_length = *puVar10;
        uVar1 = ap->gp_offset;
        if ((ulong)uVar1 < 0x29) {
          plVar9 = (long *)((ulong)uVar1 + (long)ap->reg_save_area);
          ap->gp_offset = uVar1 + 8;
        }
        else {
          plVar9 = (long *)ap->overflow_arg_area;
          ap->overflow_arg_area = plVar9 + 1;
        }
        pfVar3 = (fy_token *)*plVar9;
        if (pfVar3 == (fy_token *)0x0) goto LAB_0013cbbd;
        if (pfVar3->refs < 0) {
          __assert_fail("fyt->refs + 1 > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-token.c"
                        ,0x4e,"struct fy_token *fy_token_ref(struct fy_token *)");
        }
        pfVar3->refs = pfVar3->refs + 1;
        (fyt->field_9).tag.fyt_td = pfVar3;
      }
      else if (type == FYTT_SCALAR) {
        uVar1 = ap->gp_offset;
        if ((ulong)uVar1 < 0x29) {
          puVar10 = (uint *)((ulong)uVar1 + (long)ap->reg_save_area);
          ap->gp_offset = uVar1 + 8;
        }
        else {
          puVar10 = (uint *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar10 + 2;
        }
        uVar1 = *puVar10;
        (fyt->field_9).tag_directive.tag_length = uVar1;
        if (4 < uVar1) goto LAB_0013cbbd;
      }
      pfVar4 = (fyt->handle).fyi;
      if (pfVar4 != (fy_input *)0x0) {
        fy_input_ref(pfVar4);
        return fyt;
      }
      __assert_fail("fyt->handle.fyi",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-token.c"
                    ,0x146,
                    "struct fy_token *fy_token_vcreate(enum fy_token_type, struct __va_list_tag *)")
      ;
    }
  }
  else {
    fyt = (fy_token *)0x0;
  }
LAB_0013cbbd:
  fy_token_unref(fyt);
  return (fy_token *)0x0;
}

Assistant:

struct fy_token *fy_token_vcreate(enum fy_token_type type, va_list ap) {
    struct fy_token *fyt = NULL;
    struct fy_atom *handle;
    struct fy_token *fyt_td;

    if ((unsigned int) type > FYTT_INPUT_MARKER)
        goto err_out;

    fyt = fy_token_alloc();
    if (!fyt)
        goto err_out;
    fyt->type = type;

    handle = va_arg(ap, struct fy_atom *);
    if (!handle)
        goto err_out;
    fyt->handle = *handle;

    switch (fyt->type) {
        case FYTT_TAG_DIRECTIVE:
            fyt->tag_directive.tag_length = va_arg(ap, unsigned int);
            fyt->tag_directive.uri_length = va_arg(ap, unsigned int);
            break;
        case FYTT_SCALAR:
            fyt->scalar.style = va_arg(ap, enum fy_scalar_style);
            if ((unsigned int) fyt->scalar.style >= FYSS_MAX)
                goto err_out;
            break;
        case FYTT_TAG:
            fyt->tag.skip = va_arg(ap, unsigned int);
            fyt->tag.handle_length = va_arg(ap, unsigned int);
            fyt->tag.suffix_length = va_arg(ap, unsigned int);

            fyt_td = va_arg(ap, struct fy_token *);
            if (!fyt_td)
                goto err_out;
            fyt->tag.fyt_td = fy_token_ref(fyt_td);
            break;

        case FYTT_NONE:
            goto err_out;

        default:
            break;
    }

    assert(fyt->handle.fyi);

    /* take reference */
    fy_input_ref(fyt->handle.fyi);

    return fyt;

    err_out:
    fy_token_unref(fyt);

    return NULL;
}